

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_read_params(mbedtls_ecdh_context *ctx,uchar **buf,uchar *end)

{
  mbedtls_ecp_group_id local_30;
  int local_2c;
  mbedtls_ecp_group_id grp_id;
  int ret;
  uchar *end_local;
  uchar **buf_local;
  mbedtls_ecdh_context *ctx_local;
  
  local_2c = 0xffffff92;
  _grp_id = end;
  end_local = (uchar *)buf;
  buf_local = (uchar **)ctx;
  local_2c = mbedtls_ecp_tls_read_group_id(&local_30,buf,(long)end - (long)*buf);
  ctx_local._4_4_ = local_2c;
  if ((local_2c == 0) &&
     (local_2c = mbedtls_ecdh_setup((mbedtls_ecdh_context *)buf_local,local_30),
     ctx_local._4_4_ = local_2c, local_2c == 0)) {
    if (*(int *)(buf_local + 1) == 1) {
      ctx_local._4_4_ =
           ecdh_read_params_internal
                     ((mbedtls_ecdh_context_mbed *)(buf_local + 2),(uchar **)end_local,_grp_id);
    }
    else {
      ctx_local._4_4_ = -0x4f80;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdh_read_params(mbedtls_ecdh_context *ctx,
                             const unsigned char **buf,
                             const unsigned char *end)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group_id grp_id;
    if ((ret = mbedtls_ecp_tls_read_group_id(&grp_id, buf, end - *buf))
        != 0) {
        return ret;
    }

    if ((ret = mbedtls_ecdh_setup(ctx, grp_id)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return ecdh_read_params_internal(ctx, buf, end);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            return mbedtls_everest_read_params(&ctx->ctx.everest_ecdh,
                                               buf, end);
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return ecdh_read_params_internal(&ctx->ctx.mbed_ecdh,
                                             buf, end);
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}